

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize_x86_avx512.cpp
# Opt level: O0

void ncnn::dequantize(int *intptr,float *ptr,Mat *scale_data,Mat *bias_data,int elemcount,
                     int elempack)

{
  float fVar1;
  float fVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [24];
  undefined8 uVar8;
  int iVar9;
  long *in_RCX;
  long *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  int in_R9D;
  __m128 _v_3;
  __m256 _v_2;
  int i_1;
  __m256 _bias_avx;
  __m128 _bias;
  float bias;
  __m128 _v_1;
  __m256 _v;
  int i;
  __m256 _scale_avx;
  __m128 _scale;
  float scale;
  int size;
  int bias_data_size;
  int scale_data_size;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  int local_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  int local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float *local_470;
  undefined1 (*local_468) [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined4 uStack_2e4;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  iVar9 = in_R8D * in_R9D;
  fVar1 = *(float *)*in_RDX;
  local_4b0 = CONCAT44(fVar1,fVar1);
  uStack_4a8 = CONCAT44(fVar1,fVar1);
  auVar5 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar1),0x30);
  auVar6 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x20);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar1),0x30);
  local_140 = auVar6._0_8_;
  uStack_138 = auVar6._8_8_;
  uStack_130 = auVar5._0_8_;
  uStack_128 = auVar5._8_8_;
  local_4e0 = local_140;
  uStack_4d8 = uStack_138;
  uStack_4d0 = uStack_130;
  uStack_4c8 = uStack_128;
  uVar8 = uStack_4c8;
  uStack_4c8._0_4_ = auVar5._8_4_;
  if (1 < *(int *)((long)in_RDX + 0x2c)) {
    uStack_4c8 = uVar8;
    if (in_R9D == 8) {
      puVar3 = (undefined8 *)*in_RDX;
      local_4e0 = *puVar3;
      uStack_4d8 = puVar3[1];
      uStack_4d0 = puVar3[2];
      uStack_4c8 = puVar3[3];
    }
    if (in_R9D == 4) {
      local_4e0 = *(undefined8 *)*in_RDX;
      uStack_4d8 = ((undefined8 *)*in_RDX)[1];
      uStack_4d0 = local_4e0;
      uStack_4c8 = uStack_4d8;
      local_4b0 = local_4e0;
      uStack_4a8 = uStack_4d8;
    }
  }
  local_320 = (float)local_4e0;
  fStack_31c = (float)((ulong)local_4e0 >> 0x20);
  fStack_318 = (float)uStack_4d8;
  fStack_314 = (float)((ulong)uStack_4d8 >> 0x20);
  fStack_310 = (float)uStack_4d0;
  fStack_30c = (float)((ulong)uStack_4d0 >> 0x20);
  local_230 = (float)local_4b0;
  fStack_22c = (float)((ulong)local_4b0 >> 0x20);
  fStack_228 = (float)uStack_4a8;
  fStack_224 = (float)((ulong)uStack_4a8 >> 0x20);
  local_470 = in_RSI;
  local_468 = in_RDI;
  if (*(int *)((long)in_RCX + 0x2c) == 0) {
    for (local_4e4 = 0; local_4e4 + 7 < iVar9; local_4e4 = local_4e4 + 8) {
      auVar4 = vcvtdq2ps_avx(*local_468);
      local_300 = auVar4._0_4_;
      fStack_2fc = auVar4._4_4_;
      fStack_2f8 = auVar4._8_4_;
      fStack_2f4 = auVar4._12_4_;
      fStack_2f0 = auVar4._16_4_;
      fStack_2ec = auVar4._20_4_;
      fStack_2e8 = auVar4._24_4_;
      uStack_2e4 = auVar4._28_4_;
      local_520 = CONCAT44(fStack_2fc * fStack_31c,local_300 * local_320);
      uStack_518._0_4_ = fStack_2f8 * fStack_318;
      uStack_518._4_4_ = fStack_2f4 * fStack_314;
      uStack_510._0_4_ = fStack_2f0 * fStack_310;
      uStack_510._4_4_ = fStack_2ec * fStack_30c;
      auVar7 = _local_520;
      uStack_508._0_4_ = fStack_2e8 * (float)uStack_4c8;
      uStack_508._4_4_ = uStack_2e4;
      auVar4 = _local_520;
      uStack_510 = auVar7._16_8_;
      uStack_508 = auVar4._24_8_;
      *(undefined8 *)local_470 = local_520;
      *(undefined8 *)(local_470 + 2) = uStack_518;
      *(undefined8 *)(local_470 + 4) = uStack_510;
      *(undefined8 *)(local_470 + 6) = uStack_508;
      local_468 = local_468 + 1;
      local_470 = local_470 + 8;
    }
    for (; local_4e4 + 3 < iVar9; local_4e4 = local_4e4 + 4) {
      auVar5 = vcvtdq2ps_avx(*(undefined1 (*) [16])*local_468);
      local_220 = auVar5._0_4_;
      fStack_21c = auVar5._4_4_;
      fStack_218 = auVar5._8_4_;
      fStack_214 = auVar5._12_4_;
      local_530 = CONCAT44(fStack_21c * fStack_22c,local_220 * local_230);
      uStack_528._0_4_ = fStack_218 * fStack_228;
      uStack_528._4_4_ = fStack_214 * fStack_224;
      *(undefined8 *)local_470 = local_530;
      *(undefined8 *)(local_470 + 2) = uStack_528;
      local_468 = (undefined1 (*) [32])(*local_468 + 0x10);
      local_470 = local_470 + 4;
    }
    for (; local_4e4 < iVar9; local_4e4 = local_4e4 + 1) {
      *local_470 = (float)*(int *)*local_468 * fVar1;
      local_468 = (undefined1 (*) [32])(*local_468 + 4);
      local_470 = local_470 + 1;
    }
  }
  else {
    fVar2 = *(float *)*in_RCX;
    local_550 = CONCAT44(fVar2,fVar2);
    uStack_548 = CONCAT44(fVar2,fVar2);
    auVar5 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar2),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar2),0x30);
    auVar6 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)fVar2),0x30);
    local_100 = auVar6._0_8_;
    uStack_f8 = auVar6._8_8_;
    uStack_f0 = auVar5._0_8_;
    uStack_e8 = auVar5._8_8_;
    local_580 = local_100;
    uStack_578 = uStack_f8;
    uStack_570 = uStack_f0;
    uStack_568 = uStack_e8;
    if (1 < *(int *)((long)in_RCX + 0x2c)) {
      if (in_R9D == 8) {
        puVar3 = (undefined8 *)*in_RCX;
        local_580 = *puVar3;
        uStack_578 = puVar3[1];
        uStack_570 = puVar3[2];
        uStack_568 = puVar3[3];
      }
      if (in_R9D == 4) {
        local_580 = *(undefined8 *)*in_RCX;
        uStack_578 = ((undefined8 *)*in_RCX)[1];
        uStack_570 = local_580;
        uStack_568 = uStack_578;
        local_550 = local_580;
        uStack_548 = uStack_578;
      }
    }
    for (local_584 = 0; local_584 + 7 < iVar9; local_584 = local_584 + 8) {
      auVar4 = vcvtdq2ps_avx(*local_468);
      local_5c0._0_4_ = auVar4._0_4_;
      local_5c0._4_4_ = auVar4._4_4_;
      uStack_5b8._0_4_ = auVar4._8_4_;
      uStack_5b8._4_4_ = auVar4._12_4_;
      uStack_5b0._0_4_ = auVar4._16_4_;
      uStack_5b0._4_4_ = auVar4._20_4_;
      uStack_5a8._0_4_ = auVar4._24_4_;
      uStack_5a8._4_4_ = auVar4._28_4_;
      local_a0 = (float)local_580;
      fStack_9c = (float)((ulong)local_580 >> 0x20);
      fStack_98 = (float)uStack_578;
      fStack_94 = (float)((ulong)uStack_578 >> 0x20);
      fStack_90 = (float)uStack_570;
      fStack_8c = (float)((ulong)uStack_570 >> 0x20);
      fStack_88 = (float)uStack_568;
      fStack_84 = (float)((ulong)uStack_568 >> 0x20);
      local_5c0 = CONCAT44(local_5c0._4_4_ * fStack_31c + fStack_9c,
                           (float)local_5c0 * local_320 + local_a0);
      uStack_5b8._0_4_ = (float)uStack_5b8 * fStack_318 + fStack_98;
      uStack_5b8._4_4_ = uStack_5b8._4_4_ * fStack_314 + fStack_94;
      uStack_5b0._0_4_ = (float)uStack_5b0 * fStack_310 + fStack_90;
      uStack_5b0._4_4_ = uStack_5b0._4_4_ * fStack_30c + fStack_8c;
      auVar7 = _local_5c0;
      uStack_5a8._0_4_ = (float)uStack_5a8 * (float)uStack_4c8 + fStack_88;
      uStack_5a8._4_4_ = uStack_5a8._4_4_ + fStack_84;
      auVar4 = _local_5c0;
      uStack_5b0 = auVar7._16_8_;
      uStack_5a8 = auVar4._24_8_;
      *(undefined8 *)local_470 = local_5c0;
      *(undefined8 *)(local_470 + 2) = uStack_5b8;
      *(undefined8 *)(local_470 + 4) = uStack_5b0;
      *(undefined8 *)(local_470 + 6) = uStack_5a8;
      local_468 = local_468 + 1;
      local_470 = local_470 + 8;
    }
    for (; local_584 + 3 < iVar9; local_584 = local_584 + 4) {
      auVar5 = vcvtdq2ps_avx(*(undefined1 (*) [16])*local_468);
      local_150 = auVar5._0_4_;
      fStack_14c = auVar5._4_4_;
      fStack_148 = auVar5._8_4_;
      fStack_144 = auVar5._12_4_;
      local_50 = (float)local_550;
      fStack_4c = (float)((ulong)local_550 >> 0x20);
      fStack_48 = (float)uStack_548;
      fStack_44 = (float)((ulong)uStack_548 >> 0x20);
      local_5d0 = CONCAT44(fStack_14c * fStack_22c + fStack_4c,local_150 * local_230 + local_50);
      uStack_5c8._0_4_ = fStack_148 * fStack_228 + fStack_48;
      uStack_5c8._4_4_ = fStack_144 * fStack_224 + fStack_44;
      *(undefined8 *)local_470 = local_5d0;
      *(undefined8 *)(local_470 + 2) = uStack_5c8;
      local_468 = (undefined1 (*) [32])(*local_468 + 0x10);
      local_470 = local_470 + 4;
    }
    for (; local_584 < iVar9; local_584 = local_584 + 1) {
      *local_470 = (float)*(int *)*local_468 * fVar1 + fVar2;
      local_468 = (undefined1 (*) [32])(*local_468 + 4);
      local_470 = local_470 + 1;
    }
  }
  return;
}

Assistant:

static void dequantize(const int* intptr, float* ptr, const Mat& scale_data, const Mat& bias_data, int elemcount, int elempack)
{
    const int scale_data_size = scale_data.w;
    const int bias_data_size = bias_data.w;
    const int size = elemcount * elempack;

    // NCNN_LOGE("dequantize %d %d   %d %d", scale_data_size, bias_data_size, elemcount, elempack);

    float scale = scale_data[0];
#if __SSE2__
    __m128 _scale = _mm_set1_ps(scale);
#if __AVX__
    __m256 _scale_avx = _mm256_set1_ps(scale);
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#endif // __AVX512F__
#endif // __AVX__
    if (scale_data_size > 1)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            _scale_avx512 = _mm512_loadu_ps((const float*)scale_data);
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            _scale_avx = _mm256_loadu_ps((const float*)scale_data);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
        }
#endif // __AVX__
        if (elempack == 4)
        {
            _scale = _mm_loadu_ps((const float*)scale_data);
#if __AVX__
            _scale_avx = combine4x2_ps(_scale, _scale);
#if __AVX512F__
            _scale_avx512 = combine8x2_ps(_scale_avx, _scale_avx);
#endif // __AVX512F__
#endif // __AVX__
        }
    }
#endif // __SSE2__

    if (bias_data_size == 0)
    {
        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_mul_ps(_v, _scale_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_mul_ps(_v, _scale_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_mul_ps(_v, _scale);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale;
            intptr++;
            ptr++;
        }
    }
    else
    {
        float bias = bias_data[0];
#if __SSE2__
        __m128 _bias = _mm_set1_ps(bias);
#if __AVX__
        __m256 _bias_avx = _mm256_set1_ps(bias);
#if __AVX512F__
        __m512 _bias_avx512 = _mm512_set1_ps(bias);
#endif // __AVX512F__
#endif // __AVX__
        if (bias_data_size > 1)
        {
#if __AVX__
#if __AVX512F__
            if (elempack == 16)
            {
                _bias_avx512 = _mm512_loadu_ps((const float*)bias_data);
            }
#endif // __AVX512F__
            if (elempack == 8)
            {
                _bias_avx = _mm256_loadu_ps((const float*)bias_data);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
            }
#endif // __AVX__
            if (elempack == 4)
            {
                _bias = _mm_loadu_ps((const float*)bias_data);
#if __AVX__
                _bias_avx = combine4x2_ps(_bias, _bias);
#if __AVX512F__
                _bias_avx512 = combine8x2_ps(_bias_avx, _bias_avx);
#endif // __AVX512F__
#endif // __AVX__
            }
        }
#endif // __SSE2__

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _v = _mm512_cvtepi32_ps(_mm512_loadu_si512((const __m512i*)intptr));
            _v = _mm512_fmadd_ps(_v, _scale_avx512, _bias_avx512);
            _mm512_storeu_ps(ptr, _v);
            intptr += 16;
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _v = _mm256_cvtepi32_ps(_mm256_loadu_si256((const __m256i*)intptr));
            _v = _mm256_comp_fmadd_ps(_v, _scale_avx, _bias_avx);
            _mm256_storeu_ps(ptr, _v);
            intptr += 8;
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _v = _mm_cvtepi32_ps(_mm_loadu_si128((const __m128i*)intptr));
            _v = _mm_comp_fmadd_ps(_v, _scale, _bias);
            _mm_storeu_ps(ptr, _v);
            intptr += 4;
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *intptr * scale + bias;
            intptr++;
            ptr++;
        }
    }
}